

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-util.h
# Opt level: O0

size_t wabt::cat_compute_size<char[8],std::__cxx11::string,char[2],char_const*>
                 (char (*t) [8],
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                 char (*args_1) [2],char **args_2)

{
  size_type sVar1;
  size_t sVar2;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  char **local_28;
  char **args_local_2;
  char (*args_local_1) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  char (*t_local) [8];
  
  local_28 = args_2;
  args_local_2 = (char **)args_1;
  args_local_1 = (char (*) [2])args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,*t);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_38);
  sVar2 = cat_compute_size<std::__cxx11::string,char[2],char_const*>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     args_local_1,(char (*) [2])args_local_2,local_28);
  return sVar1 + sVar2;
}

Assistant:

size_t cat_compute_size(const T& t, const Ts&... args) {
  return std::string_view(t).size() + cat_compute_size(args...);
}